

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine_ft.cpp
# Opt level: O3

void __thiscall QFreetypeFace::cleanup(QFreetypeFace *this,EVP_PKEY_CTX *ctx)

{
  void *pvVar1;
  qt_destroy_func_t p_Var2;
  QtFreetypeData *pQVar3;
  
  pvVar1 = (this->hbFace).ptr;
  p_Var2 = (this->hbFace).destroy_func;
  (this->hbFace).ptr = (void *)0x0;
  (this->hbFace).destroy_func = (qt_destroy_func_t)0x0;
  if (p_Var2 != (qt_destroy_func_t)0x0 && pvVar1 != (void *)0x0) {
    (*p_Var2)(pvVar1);
  }
  if (this->mm_var != (FT_MM_Var *)0x0) {
    pQVar3 = qt_getFreetypeData();
    FT_Done_MM_Var(pQVar3->library,this->mm_var);
  }
  this->mm_var = (FT_MM_Var *)0x0;
  FT_Done_Face(this->face);
  this->face = (FT_Face_conflict)0x0;
  return;
}

Assistant:

void QFreetypeFace::cleanup()
{
    hbFace.reset();
    if (mm_var)
        FT_Done_MM_Var(qt_getFreetype(), mm_var);
    mm_var = nullptr;
    FT_Done_Face(face);
    face = nullptr;
}